

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O0

void __thiscall
file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~file_partial_context
          (file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  file_partial_context<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  ~file_partial_context(this);
  operator_delete(this,0x58);
  return;
}

Assistant:

file_partial_context(const basic_data<string_type>* data)
        : context<string_type>(data)
    {
    }